

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  long in_RDI;
  atomic<unsigned_long> *this_00;
  size_t in_stack_00000068;
  ThreadPool *in_stack_00000070;
  __integral_type in_stack_ffffffffffffffa8;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x17eecd);
  this_00 = (atomic<unsigned_long> *)(in_RDI + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17eee0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17eef3);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x48));
  std::mutex::mutex((mutex *)0x17ef14);
  std::atomic<unsigned_long>::atomic(this_00,in_stack_ffffffffffffffa8);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xa8));
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::list
            ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)0x17ef67);
  std::mutex::mutex((mutex *)0x17ef78);
  resize(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

ThreadPool::ThreadPool( size_t threads )
    : _runningThreadCount ( 0 )
    , _threadCount        ( 0 )
    , _threadsCreated     ( false )
{
    resize( threads );
}